

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void restart_read_request(cio_http_client *client)

{
  if (((client->http_private).request_complete == true) &&
     ((client->http_private).response_written_completed == true)) {
    restart_read_request_cold_1();
    return;
  }
  return;
}

Assistant:

static void restart_read_request(struct cio_http_client *client)
{
	if ((client->http_private.request_complete) && (client->http_private.response_written_completed)) {
		free_handler(client);
		const struct cio_http_server *server = cio_http_client_get_server(client);
		enum cio_error err = cio_timer_expires_from_now(&client->http_private.request_timer, server->read_header_timeout_ns, client_timeout_handler, client);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_server_error(client, "Could not re-arm timer for restarting a read request");
			return;
		}

		cio_write_buffer_head_init(&client->response_wbh);
		http_parser_settings_init(&client->parser_settings);
		client->parser_settings.on_url = on_url;
		http_parser_init(&client->parser, HTTP_REQUEST);

		client->http_private.response_fired = false;
		client->http_private.request_complete = false;
		client->http_private.response_written = false;
		client->http_private.response_written_completed = false;

		client->http_private.finish_func = finish_request_line;
		err = cio_buffered_stream_read_until(&client->buffered_stream, &client->rb, CIO_CRLF, parse, client);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_server_error(client, "Could not restart read request");
		}
	}
}